

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O1

void __thiscall DataContainer::Clear(DataContainer *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  ppIVar1 = (this->file_list_).
            super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->file_list_).
                 super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppIVar2 < ppIVar1; ppIVar2 = ppIVar2 + 1)
  {
    if (*ppIVar2 != (IContainedElement *)0x0) {
      (*(*ppIVar2)->_vptr_IContainedElement[1])();
    }
    ppIVar1 = (this->file_list_).
              super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppIVar2 = (this->file_list_).
            super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppIVar1 != ppIVar2) {
    (this->file_list_).super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppIVar2;
  }
  return;
}

Assistant:

void DataContainer::Clear()
{
   for (std::vector<IContainedElement*>::iterator it = file_list_.begin(); it < file_list_.end(); ++it)
   {
      delete *it;
   }

   file_list_.clear();
}